

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::set_stringvalue
          (CustomModel_CustomModelParamValue *this,string *value)

{
  if (this->_oneof_case_[0] != 0x14) {
    clear_value(this);
    this->_oneof_case_[0] = 0x14;
    this->value_ = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->value_).stringvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void CustomModel_CustomModelParamValue::set_stringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.stringValue)
  if (!has_stringvalue()) {
    clear_value();
    set_has_stringvalue();
    value_.stringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  value_.stringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.stringValue)
}